

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O3

String * __thiscall
MathML::AST::ConstantExpression::toString_abi_cxx11_
          (String *__return_storage_ptr__,ConstantExpression *this)

{
  Type TVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  sVar2 = (this->mStringValue)._M_string_length;
  TVar1 = this->mType;
  if (TVar1 == SCALAR_INVALID && sVar2 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->mStringValue)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  else {
    if (TVar1 == SCALAR_DOUBLE) {
      std::ostream::_M_insert<double>(this->mValue);
    }
    else {
      if (TVar1 != SCALAR_LONG) {
        if (TVar1 == SCALAR_BOOL) {
          bVar4 = NAN(this->mValue);
          bVar5 = this->mValue != 0.0;
          puVar7 = SCALAR_FALSE_VALUE_abi_cxx11_;
          if (bVar5) {
            puVar7 = (undefined1 *)&SCALAR_TRUE_VALUE_abi_cxx11_;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (bVar4) {
            puVar7 = (undefined1 *)&SCALAR_TRUE_VALUE_abi_cxx11_;
          }
          plVar6 = (long *)(SCALAR_FALSE_VALUE_abi_cxx11_ + 8);
          if (bVar5) {
            plVar6 = &DAT_009e0a70;
          }
          if (bVar4) {
            plVar6 = &DAT_009e0a70;
          }
          lVar8 = *plVar6;
          lVar9 = *(long *)puVar7;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          lVar8 = DAT_009e0a30;
          lVar9 = SCALAR_INVALID_VALUE_abi_cxx11_;
        }
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,lVar9,lVar8 + lVar9);
        goto LAB_00822989;
      }
      std::ostream::_M_insert<long>((long)local_188);
    }
    std::__cxx11::stringbuf::str();
  }
LAB_00822989:
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

MathML::String ConstantExpression::toString() const
        {
            std::stringstream ss;

            if ( mStringValue.size() > 0 && mType == SCALAR_INVALID )
            {
                return mStringValue;
            }

            //check type
            switch ( mType )
            {

            case SCALAR_BOOL:
                return ( mValue == 0. ) ? SCALAR_FALSE_VALUE : SCALAR_TRUE_VALUE;

            case SCALAR_LONG:
                //return StringUtil::valueOf( static_cast<long>( mValue ) );
                ss << static_cast<long>( mValue );
                return ss.str();

            case SCALAR_DOUBLE:
                //return StringUtil::valueOf( mValue );
                ss << mValue;
                return ss.str();

            default:
                return SCALAR_INVALID_VALUE;
            }
        }